

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleUsage.cpp
# Opt level: O2

void readmeExample2(void)

{
  byte *pbVar1;
  int *piVar2;
  ostream *poVar3;
  basic_ifstream<char,_std::char_traits<char>_> *stream;
  int iVar4;
  optional<int> local_dc8;
  anon_class_8_1_54a3980e_for_build local_dc0;
  OptionOrRef<int> val;
  undefined1 local_db0 [8];
  undefined1 local_da8 [584];
  Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>
  local_b60;
  Generator<LazyCode::Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:231:17)>
  local_930;
  Generator<LazyCode::Generator<LazyCode::Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:231:17)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:201:30)>
  local_6e8;
  Generator<LazyCode::Generator<LazyCode::Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:231:17)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:201:30)>
  local_488;
  LazyCode local_228 [520];
  
  std::ifstream::ifstream(local_228,"test.txt",_S_in);
  LazyCode::read<int,std::ifstream>(&local_b60,local_228,stream);
  local_dc0.n = 10;
  LazyCode::
  GeneratorBuilder<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:225:26)>
  ::anon_class_8_1_54a3980e_for_build::
  operator()<LazyCode::Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>_>
            (&local_930,&local_dc0,&local_b60);
  LazyCode::
  Generator<LazyCode::Generator<Reader,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:304:22)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:231:17)>
  ::Generator((Generator<LazyCode::Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:231:17)>
               *)&val,&local_930);
  LazyCode::
  Generator<LazyCode::Generator<Reader,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:304:22)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:231:17)>
  ::Generator(&local_6e8.member,
              (Generator<LazyCode::Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:231:17)>
               *)&val);
  std::ifstream::~ifstream(local_db0);
  LazyCode::
  Generator<LazyCode::Generator<LazyCode::Generator<Reader,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:304:22)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:231:17)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:201:30)>
  ::Generator((Generator<LazyCode::Generator<LazyCode::Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:231:17)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:201:30)>
               *)&val,&local_6e8);
  LazyCode::
  Generator<LazyCode::Generator<LazyCode::Generator<Reader,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:304:22)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:231:17)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:201:30)>
  ::Generator(&local_488,
              (Generator<LazyCode::Generator<LazyCode::Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:231:17)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:201:30)>
               *)&val);
  std::ifstream::~ifstream(local_da8);
  iVar4 = 0;
LAB_001024c7:
  LazyCode::next((LazyCode *)&val,&local_488.member);
  if (val.super_optional<int>.super_OptionalBase<int>.init_ == true) goto code_r0x001024da;
  goto LAB_001024eb;
code_r0x001024da:
  pbVar1 = (byte *)std::experimental::optional<int>::operator*((optional<int> *)&val);
  if ((*pbVar1 & 1) == 0) {
LAB_001024eb:
    if ((val.super_optional<int>.super_OptionalBase<int>.init_ & 1U) == 0) {
      std::ifstream::~ifstream(&local_488.member.member);
      std::ifstream::~ifstream(&local_6e8.member.member);
      std::ifstream::~ifstream(&local_930.member);
      std::ifstream::~ifstream(&local_b60);
      std::ifstream::~ifstream(local_228);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
      std::endl<char,std::char_traits<char>>(poVar3);
      return;
    }
    piVar2 = std::experimental::optional<int>::operator*((optional<int> *)&val);
    local_dc8.super_OptionalBase<int>.storage_.value_ = *piVar2 * *piVar2;
    local_dc8.super_OptionalBase<int>.init_ = true;
    piVar2 = std::experimental::optional<int>::operator*(&local_dc8);
    iVar4 = iVar4 + *piVar2;
  }
  goto LAB_001024c7;
}

Assistant:

void readmeExample2() {
    int total = lz::read<int>(ifstream("test.txt")) | lz::limit(10) |
                lz::filter([](int i) { return i % 2 == 0; }) |
                lz::map([](int i) { return i * i; }) | lz::sum();

    cout << total << endl;
}